

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.h
# Opt level: O1

void __thiscall
shared_data::print_update
          (shared_data *this,bool holdout_set_off,size_t current_pass,uint32_t label,
          uint32_t prediction,size_t num_features,bool progress_add,float progress_arg)

{
  _func_int *p_Var1;
  long lVar2;
  char cVar3;
  ostringstream label_buf;
  ostringstream pred_buf;
  string local_360;
  string local_340;
  undefined1 local_320 [24];
  undefined1 auStack_308 [88];
  ios_base local_2b0 [112];
  char acStack_240 [152];
  long local_1a8 [2];
  undefined8 uStack_198;
  uint auStack_190 [22];
  ios_base local_138 [112];
  char acStack_c8 [152];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(undefined8 *)(*(_func_int **)(local_320._0_8_ + -0x18) + (long)(local_320 + 0x10)) = 8;
  p_Var1 = *(_func_int **)(local_320._0_8_ + -0x18);
  if ((acStack_240 + 1)[(long)p_Var1] == '\0') {
    cVar3 = std::ios::widen((char)&stack0xfffffffffffffc88 + (char)p_Var1 + 'X');
    acStack_240[(long)p_Var1] = cVar3;
    (acStack_240 + 1)[(long)p_Var1] = '\x01';
  }
  acStack_240[(long)p_Var1] = ' ';
  p_Var1 = *(_func_int **)(local_320._0_8_ + -0x18);
  if (label < 0x7fffffff) {
    *(uint *)(p_Var1 + (long)(local_320 + 0x18)) =
         *(uint *)(p_Var1 + (long)(local_320 + 0x18)) & 0xffffff4f | 0x80;
    std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  }
  else {
    *(uint *)(p_Var1 + (long)(local_320 + 0x18)) =
         *(uint *)(p_Var1 + (long)(local_320 + 0x18)) & 0xffffff4f | 0x20;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320," unknown",8);
  }
  *(undefined8 *)((long)&uStack_198 + *(long *)(local_1a8[0] + -0x18)) = 8;
  *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
       *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffff4f | 0x80;
  lVar2 = *(long *)(local_1a8[0] + -0x18);
  if (acStack_c8[lVar2 + 1] == '\0') {
    cVar3 = std::ios::widen((char)&stack0xfffffffffffffc88 + (char)lVar2 + -0x30);
    acStack_c8[lVar2] = cVar3;
    acStack_c8[lVar2 + 1] = '\x01';
  }
  acStack_c8[lVar2] = ' ';
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  print_update(this,holdout_set_off,current_pass,&local_340,&local_360,num_features,progress_add,
               progress_arg);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_360._M_dataplus._M_p != &local_360.field_2) {
    operator_delete(local_360._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_340._M_dataplus._M_p != &local_340.field_2) {
    operator_delete(local_340._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base((ios_base *)(local_320 + 0x70));
  return;
}

Assistant:

void print_update(bool holdout_set_off, size_t current_pass, uint32_t label, uint32_t prediction, size_t num_features,
      bool progress_add, float progress_arg)
  {
    std::ostringstream label_buf, pred_buf;

    label_buf << std::setw(col_current_label) << std::setfill(' ');
    if (label < INT_MAX)
      label_buf << std::right << label;
    else
      label_buf << std::left << " unknown";

    pred_buf << std::setw(col_current_predict) << std::right << std::setfill(' ') << prediction;

    print_update(
        holdout_set_off, current_pass, label_buf.str(), pred_buf.str(), num_features, progress_add, progress_arg);
  }